

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall
kj::_::ArrayJoinPromiseNodeBase::Branch::fire(Branch *this)

{
  int *piVar1;
  long lVar2;
  Event *in_RDX;
  Event *extraout_RDX;
  Event *extraout_RDX_00;
  Event *extraout_RDX_01;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar3;
  
  lVar2 = *(long *)(in_RSI + 0x40);
  piVar1 = (int *)(lVar2 + 0x14);
  *piVar1 = *piVar1 + -1;
  if ((*piVar1 == 0) && (*(char *)(lVar2 + 0x20) == '\0')) {
    PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(lVar2 + 0x18));
    *(undefined1 *)(*(long *)(in_RSI + 0x40) + 0x20) = 1;
    in_RDX = extraout_RDX;
  }
  if (*(int *)(*(long *)(in_RSI + 0x40) + 0x10) == 1) {
    (**(code **)(**(long **)(in_RSI + 0x48) + 0x18))
              (*(long **)(in_RSI + 0x48),*(undefined8 *)(in_RSI + 0x50));
    in_RDX = extraout_RDX_00;
    if ((**(char **)(in_RSI + 0x50) == '\x01') &&
       (*(char *)(*(long *)(in_RSI + 0x40) + 0x20) == '\0')) {
      PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(*(long *)(in_RSI + 0x40) + 0x18));
      *(undefined1 *)(*(long *)(in_RSI + 0x40) + 0x20) = 1;
      in_RDX = extraout_RDX_01;
    }
  }
  (this->super_Event)._vptr_Event = (_func_int **)0x0;
  (this->super_Event).loop = (EventLoop *)0x0;
  MVar3.ptr.ptr = in_RDX;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<Event>> ArrayJoinPromiseNodeBase::Branch::fire() {
  if (--joinNode.countLeft == 0 && !joinNode.armed) {
    joinNode.onReadyEvent.arm();
    joinNode.armed = true;
  }

  if (joinNode.joinBehavior == ArrayJoinBehavior::EAGER) {
    // This implements `joinPromisesFailFast()`'s eager-evaluation semantics.
    dependency->get(output);
    if (output.exception != kj::none && !joinNode.armed) {
      joinNode.onReadyEvent.arm();
      joinNode.armed = true;
    }
  }

  return kj::none;
}